

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regexp_object.cpp
# Opt level: O2

void test_main(void)

{
  version vVar1;
  allocator<char> local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  value local_178;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string_view local_d0;
  string_view local_c0;
  gc_heap h;
  string_view local_40;
  string local_30;
  
  vVar1 = tested_version();
  if (vVar1 == es1) {
    h.pointers_.set_ = (gc_heap_ptr_untyped **)0xd;
    h.pointers_._8_8_ = anon_var_dwarf_2c6e;
    expect_eval_exception_abi_cxx11_(&local_30,(wstring_view *)&h);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    local_f0._M_dataplus._M_p = (pointer)0x235;
    local_f0._M_string_length = 0x17709c;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"testspec@",(allocator<char> *)&local_c0);
    std::operator+(&local_110,&local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                  );
    std::operator+(&local_198,&local_110,"@");
    std::operator+(&local_1b8,&local_198,"test_main");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_1b8,"@");
    std::__cxx11::to_string(&local_150,0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_150);
    local_d0._M_len._0_4_ = h.pointers_.capacity_;
    local_d0._M_len._4_4_ = h.pointers_.size_;
    local_d0._M_str = (char *)h.pointers_.set_;
    mjs::run_test_spec((string_view *)&local_f0,&local_d0);
    std::__cxx11::string::~string((string *)&h);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    local_f0._M_dataplus._M_p = (pointer)0x10c;
    local_f0._M_string_length = 0x177340;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"testspec@",(allocator<char> *)&local_c0);
    std::operator+(&local_110,&local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                  );
    std::operator+(&local_198,&local_110,"@");
    std::operator+(&local_1b8,&local_198,"test_main");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_1b8,"@");
    std::__cxx11::to_string(&local_150,0x3d);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_150);
    local_d0._M_len._0_4_ = h.pointers_.capacity_;
    local_d0._M_len._4_4_ = h.pointers_.size_;
    local_d0._M_str = (char *)h.pointers_.set_;
    mjs::run_test_spec((string_view *)&local_f0,&local_d0);
    std::__cxx11::string::~string((string *)&h);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    local_f0._M_dataplus._M_p = (pointer)0x146;
    local_f0._M_string_length = 0x17744d;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"testspec@",(allocator<char> *)&local_c0);
    std::operator+(&local_110,&local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                  );
    std::operator+(&local_198,&local_110,"@");
    std::operator+(&local_1b8,&local_198,"test_main");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_1b8,"@");
    std::__cxx11::to_string(&local_150,0x52);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_150);
    local_d0._M_len._0_4_ = h.pointers_.capacity_;
    local_d0._M_len._4_4_ = h.pointers_.size_;
    local_d0._M_str = (char *)h.pointers_.set_;
    mjs::run_test_spec((string_view *)&local_f0,&local_d0);
    std::__cxx11::string::~string((string *)&h);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    local_f0._M_dataplus._M_p = (pointer)0x4b5;
    local_f0._M_string_length = 0x177594;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"testspec@",(allocator<char> *)&local_c0);
    std::operator+(&local_110,&local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                  );
    std::operator+(&local_198,&local_110,"@");
    std::operator+(&local_1b8,&local_198,"test_main");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_1b8,"@");
    std::__cxx11::to_string(&local_150,0x8a);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_150);
    local_d0._M_len._0_4_ = h.pointers_.capacity_;
    local_d0._M_len._4_4_ = h.pointers_.size_;
    local_d0._M_str = (char *)h.pointers_.set_;
    mjs::run_test_spec((string_view *)&local_f0,&local_d0);
    std::__cxx11::string::~string((string *)&h);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    local_f0._M_dataplus._M_p = (pointer)0x43f;
    local_f0._M_string_length = 0x177a4a;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"testspec@",(allocator<char> *)&local_c0);
    std::operator+(&local_110,&local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                  );
    std::operator+(&local_198,&local_110,"@");
    std::operator+(&local_1b8,&local_198,"test_main");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_1b8,"@");
    std::__cxx11::to_string(&local_150,0xb1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178,
                   &local_150);
    local_d0._M_len._0_4_ = h.pointers_.capacity_;
    local_d0._M_len._4_4_ = h.pointers_.size_;
    local_d0._M_str = (char *)h.pointers_.set_;
    mjs::run_test_spec((string_view *)&local_f0,&local_d0);
    std::__cxx11::string::~string((string *)&h);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    mjs::gc_heap::gc_heap(&h,0x2000);
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                       ,0xb5);
    local_1b8._M_dataplus._M_p = (pointer)0x17;
    local_1b8._M_string_length = 0x17703c;
    vVar1 = tested_version();
    if ((int)vVar1 < 2) {
      mjs::value::value(&local_178,(value *)&mjs::value::undefined);
    }
    else {
      local_198._M_dataplus._M_p = (pointer)0x4;
      local_198._M_string_length = 0x177e8a;
      mjs::string::string((string *)&local_d0,&h,(string_view *)&local_198);
      mjs::value::value(&local_178,(string *)&local_d0);
    }
    run_test((wstring_view *)&local_1b8,&local_178);
    mjs::value::~value(&local_178);
    if (1 < (int)vVar1) {
      mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_d0);
    }
    vVar1 = tested_version();
    if (1 < (int)vVar1) {
      local_c0._M_len = 0x80;
      local_c0._M_str =
           "\nr = /[/]/;\nr.source; //$string \'[\\\\/]\'\nr.global; //$boolean false\nr.ignoreCase; //$boolean false\nr.multiline; //$boolean false\n"
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"testspec@",&local_1b9);
      std::operator+(&local_130,&local_150,
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                    );
      std::operator+(&local_110,&local_130,"@");
      std::operator+(&local_198,&local_110,"test_main");
      std::operator+(&local_1b8,&local_198,"@");
      std::__cxx11::to_string(&local_f0,0xbe);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178
                     ,&local_1b8,&local_f0);
      local_40._M_len = (size_t)local_178.field_1.n_;
      local_40._M_str = (char *)local_178._0_8_;
      mjs::run_test_spec(&local_c0,&local_40);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
    }
    mjs::gc_heap::~gc_heap(&h);
  }
  return;
}

Assistant:

void test_main() {
    if (tested_version() == version::es1) {
        expect_eval_exception(L"new RegExp();");
        // That RegExp literals aren't supported is tested elsewhere
        return;
    }

    // TODO: There will be looooooots of cases missing here...

    RUN_TEST_SPEC(R"(
r=new RegExp();

r.key=42;
keys = '';
for (var k in r) { keys += k+','; }
keys; //$string 'key,'

delete r.source;
r.source; //$string '(?:)'
r.source=42;
r.source; //$string '(?:)'

delete r.global;
r.global; //$boolean false
r.global = 42;
r.global; //$boolean false

delete r.ignoreCase;
r.ignoreCase; //$boolean false
r.ignoreCase = 42;
r.ignoreCase; //$boolean false

delete r.multiline;
r.multiline; //$boolean false
r.multiline = false;
r.multiline; //$boolean false

delete r.lastIndex;
r.lastIndex; //$number 0
r.lastIndex = 42;
r.lastIndex; //$number 42
)");

    RUN_TEST_SPEC(R"(
RegExp.prototype.constructor.length;//$number 2
r=RegExp.prototype.constructor('a*b', 'gim');

r.source; //$string 'a*b'
r.global; //$boolean true
r.ignoreCase; //$boolean true
r.multiline; //$boolean true
r.lastIndex; //$number 0

r.toString(); //$string '/a*b/gim'
)");


    //
    // RegExp literal
    //

    RUN_TEST_SPEC(R"(
r = / test \/ foo /gi;

r instanceof RegExp; //$boolean true
r.source; //$string ' test \\/ foo '
r.global; //$boolean true
r.ignoreCase; //$boolean true
r.multiline; //$boolean false
r.lastIndex; //$number 0

r.toString(); //$string '/ test \\/ foo /gi'

x = /a/gi; x === x; //$boolean true
/a/gi == /a/gi; //$boolean false
)");

    //
    // Check basic matching
    //
    RUN_TEST_SPEC(R"(
r = /(a*)b/;

r.exec('xx');       //$null
r.test('xx');       //$boolean false

/undef/.test();     //$boolean true

x = r.exec('aabb');
x instanceof Array; //$boolean true
x.length;           //$number 2
x[0];               //$string 'aab'
x[1];               //$string 'aa'
x.index;            //$number 0
x.input;            //$string 'aabb'
r.lastIndex;        //$number 0

x = r.exec('aabb');
x.length;           //$number 2
x[0];               //$string 'aab'
x[1];               //$string 'aa'
x.index;            //$number 0
x.input;            //$string 'aabb'
r.lastIndex;        //$number 0

r.test('aaaaaabb'); //$boolean true

y = r.exec('x ab');
y.length;           //$number 2
y[0];               //$string 'ab'
y[1];               //$string 'a'
y.index;            //$number 2
y.input;            //$string 'x ab'

r = /\w+/g;
s = 'xx yy zz';
w = r.exec(s);

w.length;           //$number 1
w[0];               //$string 'xx'
r.lastIndex;        //$number 2

w = r.exec(s);
w.length;           //$number 1
w[0];               //$string 'yy'
r.lastIndex;        //$number 5

w = r.exec(s);
w.length;           //$number 1
w[0];               //$string 'zz'
r.lastIndex;        //$number 8
)");

    //TODO:
    // - Invalid flags (no duplicates, case sensitive, invalid characters not allowed) => SyntaxError
    // - Invalid pattern => SyntaxError
    // - Matching (basic)
    //    - RegExp.prototype.exec(string)
    //    - RegExp.prototype.test(string) `RegExp.prototype.exec(string) != null`
    // - Multiline regex
    // - RegExp use with String
    // - Constructor corner cases
    // - etc...
    //
    // SyntaxError
    //
    // ES3, 15.10.2.5, 15.10.2.9, 15.10.2.15, 15.10.2.19
    //

    RUN_TEST_SPEC(R"(
// ES3, 15.10.3.1
r =  /xyz/g;
RegExp(r) === r; //$boolean true
RegExp(r,undefined) === r; //$boolean true
new RegExp(r) === r; //$boolean false

// ES3, 15.10.4.1
re = new RegExp(/ab/gi, undefined);
re.source;//$string 'ab'
re.global;//$boolean true
re.ignoreCase;//$boolean true
try { RegExp(/ab/,'gi'); } catch (e) { e.toString(); } //$string 'TypeError: Invalid flags argument to RegExp constructor'
try { new RegExp(/ab/,'gi'); } catch (e) { e.toString(); } //$string 'TypeError: Invalid flags argument to RegExp constructor'
try { new RegExp('123','x'); } catch (e) { e.toString(); } //$string 'SyntaxError: Invalid flag \'x\' given to RegExp constructor'
try { new RegExp('123','gig'); } catch (e) { e.toString(); } //$string 'SyntaxError: Duplicate flag \'g\' given to RegExp constructor'
// ES3, 15.10.6
function e(func) { try { RegExp.prototype[func].call({}); } catch (e) { return e.toString(); } };
e('toString'); //$string 'TypeError: Object is not a RegExp'
e('exec'); //$string 'TypeError: Object is not a RegExp'
e('test'); //$string 'TypeError: Object is not a RegExp'
)");

    // From ES5 RegExp.prototype is a RegExp object
    gc_heap h{8192};
    RUN_TEST(L"RegExp.prototype.source", tested_version() >= version::es5 ? value{string{h,"(?:)"}} : value::undefined);

    if (tested_version() >= version::es5) {
        RUN_TEST_SPEC(R"(
r = /[/]/;
r.source; //$string '[\\/]'
r.global; //$boolean false
r.ignoreCase; //$boolean false
r.multiline; //$boolean false
)");
    }
}